

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkPointTrifaceRot::IntLoadConstraint_C
          (ChLinkPointTrifaceRot *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  ulong uVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 auVar13 [16];
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined8 in_XMM1_Qb;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  uVar15 = (ulong)off_L;
  iVar14 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar14 == '\0') {
    return;
  }
  peVar3 = (this->mtriangle).mnodeB2.
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (this->mtriangle).mnodeB1.
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5 = (this->mtriangle).mnodeB3.
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar22 = *(double *)&peVar4->field_0x28;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(double *)&peVar5->field_0x28;
  dVar1 = *(double *)&peVar4->field_0x30;
  dVar26 = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20;
  dVar24 = *(double *)&(peVar4->super_ChNodeFEAbase).field_0x20;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(double *)&peVar5->field_0x30;
  dVar2 = *(double *)&(peVar5->super_ChNodeFEAbase).field_0x20;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar2;
  peVar6 = (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar28 = *(double *)&peVar3->field_0x30 - dVar1;
  dVar35 = *(double *)&peVar5->field_0x28 - dVar22;
  dVar36 = dVar26 - dVar24;
  dVar9 = *(double *)&peVar3->field_0x28 - dVar22;
  dVar10 = *(double *)&peVar5->field_0x30 - dVar1;
  dVar2 = dVar2 - dVar24;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar9;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar10;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar35 * dVar28;
  auVar29 = vfmsub231sd_fma(auVar40,auVar29,auVar37);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar28;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar10 * dVar36;
  auVar17 = vfmsub231sd_fma(auVar38,auVar32,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar36;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2 * dVar9;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar35;
  auVar21 = vfmsub231sd_fma(auVar19,auVar21,auVar33);
  dVar35 = auVar17._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar35 * dVar35;
  auVar17 = vfmadd231sd_fma(auVar18,auVar29,auVar29);
  auVar17 = vfmadd231sd_fma(auVar17,auVar21,auVar21);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  bVar12 = 2.2250738585072014e-308 <= auVar17._0_8_;
  dVar28 = 1.0 / auVar17._0_8_;
  dVar2 = this->s2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = 1.0 - dVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = this->s3;
  auVar17 = vsubsd_avx512f(auVar39,auVar42);
  dVar36 = auVar17._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar36 * dVar22;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)&peVar6->field_0x28;
  auVar17 = vsubsd_avx512f(auVar41,auVar17);
  auVar18 = vmulsd_avx512f(auVar30,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = this->s3;
  auVar19 = vmulsd_avx512f(auVar31,auVar43);
  auVar20 = vmulsd_avx512f(auVar34,auVar43);
  dVar22 = this->d;
  dVar26 = ((((*(double *)&(peVar6->super_ChNodeFEAbase).field_0x20 - dVar36 * dVar24) -
             dVar26 * dVar2) - auVar18._0_8_) -
           (double)((ulong)bVar12 * (long)(auVar29._0_8_ * dVar28) +
                   (ulong)!bVar12 * 0x3ff0000000000000) * dVar22) * c;
  dVar24 = (((auVar17._0_8_ - *(double *)&peVar3->field_0x28 * dVar2) - auVar19._0_8_) -
           (double)((ulong)bVar12 * (long)(dVar35 * dVar28)) * dVar22) * c;
  dVar22 = ((((*(double *)&peVar6->field_0x30 - dVar36 * dVar1) -
             *(double *)&peVar3->field_0x30 * dVar2) - auVar20._0_8_) -
           dVar22 * (double)((ulong)bVar12 * (long)(auVar21._0_8_ * dVar28))) * c;
  if (do_clamp) {
    auVar13._8_8_ = in_XMM1_Qb;
    auVar13._0_8_ = recovery_clamp;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar21 = vxorpd_avx512vl(auVar13,auVar11);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar26;
    auVar17 = vmaxsd_avx(auVar27,auVar21);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar24;
    auVar29 = vmaxsd_avx(auVar25,auVar21);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar22;
    auVar21 = vmaxsd_avx(auVar23,auVar21);
    auVar17 = vminsd_avx(auVar17,auVar13);
    dVar26 = auVar17._0_8_;
    auVar17 = vminsd_avx(auVar29,auVar13);
    dVar24 = auVar17._0_8_;
    auVar17 = vminsd_avx(auVar21,auVar13);
    dVar22 = auVar17._0_8_;
  }
  uVar7 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar15 < (long)uVar7) {
    pdVar8 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar8[uVar15] = dVar26 + pdVar8[uVar15];
    uVar15 = (ulong)(off_L + 1);
    if (uVar15 < uVar7) {
      uVar16 = (ulong)(off_L + 2);
      pdVar8[uVar15] = dVar24 + pdVar8[uVar15];
      if (uVar16 < uVar7) {
        pdVar8[uVar16] = dVar22 + pdVar8[uVar16];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkPointTrifaceRot::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                                ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                                const double c,            // a scaling factor
                                                bool do_clamp,             // apply clamping to c*C?
                                                double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    // Compute residual of constraint as distance of two points: one is A,
    // other is on triangle at the s2,s3 area coordinates:
    //  C = A - s1*B1 - s2*B2 - s3*B3
    // If an offset d is desired, along normal N, this becomes:
    //  C = A - s1*B1 - s2*B2 - s3*B3 - d*N

    ChVector<> N = Vcross(mtriangle.mnodeB2->coord.pos - mtriangle.mnodeB1->coord.pos,
                          mtriangle.mnodeB3->coord.pos - mtriangle.mnodeB1->coord.pos);
    N.Normalize();
    double s1 = 1 - s2 - s3;

    ChVector<> res = mnodeA->GetPos() - s1 * mtriangle.mnodeB1->coord.pos - s2 * mtriangle.mnodeB2->coord.pos -
                     s3 * mtriangle.mnodeB3->coord.pos - N * d;

    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cres.x();
    Qc(off_L + 1) += cres.y();
    Qc(off_L + 2) += cres.z();
}